

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.cc
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  GlobalArray *pGVar5;
  int *piVar6;
  int *subscript;
  GlobalArray *this;
  void *buf;
  long lVar7;
  long lVar8;
  long lVar9;
  char *__s;
  uint ndim_00;
  ulong uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  int ndim;
  int ld [3];
  int adims [4];
  int hi [4];
  int lo [4];
  int type;
  int block [4];
  double *ptr;
  int dims [4];
  int locdim [4];
  uint local_134;
  int *local_130;
  ulong local_128;
  undefined8 local_120;
  int local_114;
  int aiStack_110 [10];
  int local_e8 [5];
  int local_d4;
  GlobalArray *local_d0;
  int local_c8 [4];
  int *local_b8;
  double *local_b0;
  int local_a8 [30];
  
  GA::Initialize(argc,argv,3000000,3000000,0x3f4,0);
  iVar2 = GA_Nodeid();
  iVar3 = GA_Nnodes();
  local_128 = CONCAT44(extraout_var,iVar3);
  if (iVar2 == 0) {
    puts("Creating array A");
    fflush(_stdout);
  }
  local_a8[0] = 10;
  local_a8[1] = 0x14;
  local_a8[2] = 0x1e;
  local_a8[3] = 0x28;
  pGVar5 = GA::GAServices::createGA
                     ((GAServices *)&GA::SERVICES,0x3f5,4,local_a8,"array A",(int *)0x0);
  if (iVar2 == 0) {
    puts("OK\n");
    printf("handle = %d\n",(ulong)(uint)pGVar5->mHandle);
    GA::GlobalArray::inquire(pGVar5,&local_d4,(int *)&local_134,aiStack_110 + 2);
    puts("After Inquire");
  }
  else {
    GA::GlobalArray::inquire(pGVar5,&local_d4,(int *)&local_134,aiStack_110 + 2);
  }
  GA::GlobalArray::printDistribution(pGVar5);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (iVar2 == 0) {
    puts("\nReconstructing distribution description for A");
  }
  lVar8 = (long)(int)local_128;
  piVar6 = (int *)malloc(lVar8 * 4);
  if (piVar6 == (int *)0x0) {
    GA_Error("malloc failed for proclist",0);
  }
  local_130 = (int *)malloc(lVar8 << 5);
  if (local_130 == (int *)0x0) {
    GA_Error("malloc failed for regions",0);
  }
  uVar4 = local_134;
  subscript = (int *)malloc((long)(int)((int)local_128 + local_134) << 2);
  if (subscript == (int *)0x0) {
    GA_Error("malloc failed for map",0);
    uVar4 = local_134;
  }
  if (0 < (int)uVar4) {
    uVar10 = 0;
    memset(local_e8,0,(ulong)uVar4 * 4);
    do {
      aiStack_110[uVar10 + 6] = aiStack_110[uVar10 + 2] + -1;
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  local_120 = pGVar5;
  uVar4 = GA::GlobalArray::locateRegion(pGVar5,local_e8,aiStack_110 + 6,local_130,piVar6);
  if ((int)uVar4 < 1) {
    GA_Error("error in NGA_Locate_region",uVar4);
  }
  lVar8 = (long)(int)local_134;
  local_b8 = piVar6;
  if (lVar8 < 1) {
    ndim_00 = 0;
  }
  else {
    lVar9 = 0;
    memset(local_c8,0,lVar8 << 2);
    memset(aiStack_110 + 2,0,lVar8 << 2);
    piVar6 = local_130 + 4;
    ndim_00 = 0;
    do {
      if (0 < (int)uVar4) {
        iVar3 = aiStack_110[lVar9 + 2];
        lVar7 = 0;
        do {
          iVar12 = *(int *)((long)piVar6 + lVar7);
          if (iVar3 < iVar12) {
            iVar3 = *(int *)((long)piVar6 + lVar7 + -0x10);
            local_c8[lVar9] = local_c8[lVar9] + 1;
            subscript[(int)ndim_00] = iVar3;
            ndim_00 = ndim_00 + 1;
            aiStack_110[lVar9 + 2] = iVar12;
            iVar3 = iVar12;
          }
          lVar7 = lVar7 + 0x20;
        } while ((ulong)uVar4 << 5 != lVar7);
      }
      lVar9 = lVar9 + 1;
      piVar6 = piVar6 + 1;
    } while (lVar9 != lVar8);
  }
  if (iVar2 == 0) {
    printf("Distribution map contains %d elements\n",(ulong)ndim_00);
    print_subscript("number of blocks for each dimension",local_134,local_c8,"\n");
    print_subscript("distribution map",ndim_00,subscript,"\n\n");
    fflush(_stdout);
    puts("Creating array B applying distribution of A");
  }
  this = GA::GAServices::createGA
                   ((GAServices *)&GA::SERVICES,0x3f5,4,local_a8,"array B",local_c8,subscript);
  piVar6 = local_b8;
  pGVar5 = local_120;
  if (this == (GlobalArray *)0x0) {
    GA_Error("create failed: B",0);
  }
  local_d0 = this;
  if (iVar2 == 0) {
    puts("OK\n");
    free(piVar6);
    free(local_130);
    free(subscript);
    GA::GlobalArray::printDistribution(this);
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
    puts("\nCompare distributions of A and B");
    iVar3 = GA::GlobalArray::compareDistr(pGVar5,this);
    __s = "Failure: distributions NOT identical";
    if (iVar3 == 0) {
      __s = "Success: distributions identical";
    }
    puts(__s);
    fflush(_stdout);
    puts("\nAccessing local elements of A: set them to the owner process id");
    fflush(_stdout);
  }
  else {
    free(piVar6);
    free(local_130);
    free(subscript);
    GA::GlobalArray::printDistribution(this);
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  GA::GlobalArray::distribution(pGVar5,iVar2,local_e8,aiStack_110 + 6);
  if (-1 < aiStack_110[6]) {
    GA::GlobalArray::access(pGVar5,(char *)local_e8,(int)aiStack_110 + 0x18);
    if (0 < (long)(int)local_134) {
      lVar8 = 0;
      do {
        local_a8[lVar8 + 4] = (aiStack_110[lVar8 + 6] - local_e8[lVar8]) + 1;
        lVar8 = lVar8 + 1;
      } while ((int)local_134 != lVar8);
    }
    fillPatch(local_b0,local_a8 + 4,&local_114,local_134,(double)iVar2);
  }
  local_130 = (int *)CONCAT44(local_130._4_4_,iVar2);
  if (0 < (int)local_128) {
    iVar2 = 0;
    do {
      if (((uint)local_130 == iVar2) && (-1 < aiStack_110[6])) {
        sprintf((char *)(local_a8 + 4),"%d: leading dimensions",(ulong)local_130 & 0xffffffff);
        print_subscript((char *)(local_a8 + 4),local_134 - 1,&local_114,"\n");
        fflush(_stdout);
      }
      GA::GAServices::sync((GAServices *)&GA::SERVICES);
      iVar2 = iVar2 + 1;
    } while ((int)local_128 != iVar2);
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  uVar4 = (uint)local_130;
  if ((uint)local_130 == 0) {
    puts("\nRandomly checking the update using ga_get on array sections");
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  srand(uVar4);
  lVar8 = (long)(int)local_134;
  iVar2 = aiStack_110[lVar8 + 1];
  iVar3 = iVar2 + -1;
  aiStack_110[lVar8 + 5] = iVar3;
  if (2 < lVar8) {
    lVar9 = lVar8 + -3;
    auVar11._8_4_ = (int)lVar9;
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_001b2020;
    do {
      auVar13._8_4_ = (int)uVar10;
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = (int)(uVar10 >> 0x20);
      auVar14 = (auVar13 | _DAT_001b2010) ^ _DAT_001b2020;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        aiStack_110[uVar10] = 1;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        aiStack_110[uVar10 + 1] = 1;
      }
      auVar13 = (auVar13 | _DAT_001b2050) ^ _DAT_001b2020;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        aiStack_110[uVar10 + 2] = 1;
        aiStack_110[uVar10 + 3] = 1;
      }
      uVar10 = uVar10 + 4;
    } while ((local_134 + 1 & 0xfffffffc) != uVar10);
  }
  *(int *)((long)&local_120 + lVar8 * 4 + 4) = iVar3;
  buf = malloc((long)iVar2 << 3);
  if (buf == (void *)0x0) {
    GA_Error("malloc failed for buf",0);
  }
  if ((int)uVar4 <= (int)(((uint)(local_128 >> 0x1f) & 1) + (int)local_128) >> 1) {
    iVar2 = 0;
    uVar10 = (ulong)local_134;
    do {
      local_e8[(long)(int)uVar10 + -1] = 0;
      if (1 < (int)uVar10) {
        lVar8 = 0;
        do {
          iVar3 = rand();
          aiStack_110[lVar8 + 6] = iVar3 % aiStack_110[lVar8 + 2];
          local_e8[lVar8] = iVar3 % aiStack_110[lVar8 + 2];
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)(int)local_134 + -1);
      }
      GA::GlobalArray::get(local_120,local_e8,aiStack_110 + 6,buf,&local_114);
      uVar10 = (ulong)(int)local_134;
      if (0 < aiStack_110[uVar10 + 1]) {
        lVar8 = 0;
        do {
          uVar4 = GA::GlobalArray::locate(local_120,local_e8);
          dVar1 = *(double *)((long)buf + lVar8 * 8);
          if ((dVar1 != (double)(int)uVar4) || (NAN(dVar1) || NAN((double)(int)uVar4))) {
            sprintf((char *)(local_a8 + 4),"%d: wrong value: %d != %f a",
                    (ulong)local_130 & 0xffffffff,(ulong)uVar4);
            print_subscript((char *)(local_a8 + 4),local_134,local_e8,"\n");
            GA_Error("Error - bye",(int)lVar8);
          }
          uVar10 = (ulong)(int)local_134;
          local_e8[uVar10 - 1] = local_e8[uVar10 - 1] + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < aiStack_110[uVar10 + 1]);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 10);
  }
  free(buf);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if ((uint)local_130 == 0) {
    puts("OK");
    GA::GlobalArray::destroy(local_120);
    GA::GlobalArray::destroy(local_d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Terminating\n",0xc);
  }
  else {
    GA::GlobalArray::destroy(local_120);
    GA::GlobalArray::destroy(local_d0);
  }
  GA::Terminate();
  return 0;
}

Assistant:

int 
main(int argc, char *argv[]) {
 
  int me, nproc, proc, loop;
  int dims[NDIM], lo[NDIM], hi[NDIM], block[NDIM], ld[NDIM-1];
  int i,d,*proclist, offset;
  int adims[NDIM], ndim,type;
  typedef struct {
    int lo[NDIM];
    int hi[NDIM];
  } patch_t;
  patch_t *regions;
  int *map;
  double *buf;
  int heap  = 3000000, stack = 3000000;
  
  GA::Initialize(argc, argv, heap, stack, GA_DATA_TYPE, 0);
  me=GA_Nodeid(); nproc=GA_Nnodes();


  /***** create array A with default distribution  *****/
  if(me==0){printf("Creating array A\n"); fflush(stdout);}
  for(i = 0; i<NDIM; i++)
    dims[i] = N*(i+1);
  GA::GlobalArray *g_a = GA::SERVICES.createGA(MT_F_DBL, NDIM, dims, 
					       (char *)"array A", NULL);
  if(me==0)printf("OK\n\n");
  if(me==0)printf("handle = %d\n", g_a->handle());
  /* print info about array we got */
  g_a->inquire(&type, &ndim, adims);
  if(me==0)printf("After Inquire\n");
  g_a->printDistribution();

  GA::SERVICES.sync();
  /* duplicate array A with ga_create irreg rather than ga_duplicate
   * -- want to show distribution control 
   * -- with ga_duplicate it would be g_b=GA_Duplicate(g_a,name) 
   */
  if(me==0)printf("\nReconstructing distribution description for A\n");

  /* get memory for arrays describing distribution */
  proclist = (int*)malloc(nproc*sizeof(int));
  if(!proclist)GA_Error((char *)"malloc failed for proclist",0);
  regions = (patch_t*)malloc(nproc*sizeof(patch_t));
  if(!regions)GA_Error((char *)"malloc failed for regions",0);
  map = (int*)malloc((nproc+ndim)*sizeof(int)); /* ubound= nproc+mdim */
  if(!map)GA_Error((char *)"malloc failed for map",0);

  /* first find out how array g_a is distributed */
  for(i=0;i<ndim;i++)lo[i]=BASE;
  for(i=0;i<ndim;i++)hi[i]=adims[i] -1 + BASE;
  proc = g_a->locateRegion(lo, hi, (int*)regions, proclist);
  if(proc<1) GA_Error((char *)"error in NGA_Locate_region",proc);

  /* determine blocking for each dimension */
  for(i=0;i<ndim;i++)block[i]=0;
  for(i=0;i<ndim;i++)adims[i]=0;
     
  offset =0;
  for(d=0; d<ndim; d++)
    for(i=0;i<proc;i++)
      if( regions[i].hi[d]>adims[d] ){
	map[offset] = regions[i].lo[d];
	offset++;
	block[d]++;
	adims[d]= regions[i].hi[d];
      }
            
  if(me==0){
    printf("Distribution map contains %d elements\n",offset); 
    print_subscript((char *)"number of blocks for each dimension",
		    ndim,block,(char *)"\n");
    print_subscript((char *)"distribution map",offset,map,(char *)"\n\n");
    fflush(stdout);
  }
     
  if(me==0)printf("Creating array B applying distribution of A\n");

#    ifdef USE_DUPLICATE
  GA::GlobalArray *g_b = GA::SERVICES.createGA(g_a, "array B");
#    else
  GA::GlobalArray *g_b = GA::SERVICES.createGA(MT_F_DBL, NDIM, dims, 
					       (char *)"array B", block, map);
#    endif
  if(!g_b) GA_Error((char *)"create failed: B",0); 
  if(me==0)printf("OK\n\n");
  free(proclist); free(regions); free(map);
     
  g_b->printDistribution();

  GA::SERVICES.sync();

  if(me==0){
    printf("\nCompare distributions of A and B\n");
    if(g_a->compareDistr(g_b))
      printf("Failure: distributions NOT identical\n");
    else 
      printf("Success: distributions identical\n");
    fflush(stdout);
  }
       

  if(me==0){
    printf("\nAccessing local elements of A: set them to the owner process id\n");
    fflush(stdout);
  }
  GA::SERVICES.sync();

  g_a->distribution(me, lo, hi);

  if(hi[0]>=0){/* -1 means no elements stored on this processor */
    double *ptr;
    int locdim[NDIM];
    g_a->access(lo, hi, &ptr, ld);
    for(i=0;i<ndim;i++)locdim[i]=hi[i]-lo[i]+1;
    fillPatch(ptr, locdim, ld, ndim,(double)me);
  }

  for(i=0;i<nproc; i++){
    if(me==i && hi[0]>=0){
      char msg[100];
      sprintf(msg,(char *)"%d: leading dimensions",me);
      print_subscript(msg,ndim-1,ld,(char *)"\n");
      fflush(stdout);
    }
    GA::SERVICES.sync();
  }
     
  GA::SERVICES.sync();
  if(me==0)printf("\nRandomly checking the update using ga_get on array sections\n");
  GA::SERVICES.sync();

  /* show ga_get working and verify array updates 
   * every process does N random gets
   * for simplicity get only a single row at a time
   */
  srand(me); /* different seed for every process */
  hi[ndim-1]=adims[ndim-1] -1 + BASE;
  for(i=1;i<ndim-1; i++)ld[i]=1; ld[ndim-2]=adims[ndim-1] -1 + BASE;

  /* get buffer memory */
  buf = (double*)malloc(adims[ndim-1]*sizeof(double));
  if(!buf)GA_Error((char *)"malloc failed for buf",0);

  /* half of the processes check the result */
  if(me<=nproc/2) 
    for(loop = 0; loop< N; loop++){ /* task parallel loop */
      lo[ndim-1]=BASE;
      for (i= 0; i < ndim -1; i ++){
	lo[i] = hi[i] = rand()%adims[i]+BASE; 
      }

      /* print_subscript("getting",ndim,lo,"\n");*/
      g_a->get(lo, hi, buf, ld); 
         
      /* check values */
      for(i=0;i<adims[ndim-1]; i++){
	int p = g_a->locate(lo);
	if((double)p != buf[i]) {
	  char msg[100];
	  sprintf(msg,(char *)"%d: wrong value: %d != %f a",me, p, buf[i]);
	  print_subscript(msg,ndim,lo,(char *)"\n");
	  GA_Error((char *)"Error - bye",i);  
	}
	lo[ndim-1]++;
      }
    }
             
  free(buf);
  GA::SERVICES.sync();
           
  if(me==0)printf("OK\n");
     
  g_a->destroy();
  g_b->destroy();
  if(!me) cout << "Terminating\n";
  GA::Terminate();
}